

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# displacement_geometry_device.cpp
# Opt level: O0

float embree::displacement_dv(Vec3fa *P,Vec3fa *dPdv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  float fVar5;
  float fVar6;
  float dv;
  undefined8 local_148;
  Vec3fa *P_00;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined4 local_11c;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined4 local_e4;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined8 *local_c8;
  undefined4 local_bc;
  undefined8 *local_b8;
  undefined8 *local_a8;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 *local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined8 *local_40;
  undefined8 local_38;
  Vec3fa *pVStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  undefined4 uStack_8;
  
  local_11c = 0x3a83126f;
  local_e0 = &local_148;
  local_e4 = 0x3a83126f;
  local_b8 = &local_108;
  local_bc = 0x3a83126f;
  uStack_8 = 0x3a83126f;
  local_18 = 0x3a83126f;
  uStack_14 = 0x3a83126f;
  uStack_10 = 0x3a83126f;
  uStack_c = 0x3a83126f;
  local_108 = 0x3a83126f3a83126f;
  uStack_100 = 0x3a83126f3a83126f;
  local_a0 = &local_148;
  local_a8 = &local_108;
  local_88 = 0x3a83126f3a83126f;
  uStack_80 = 0x3a83126f3a83126f;
  uVar1 = *in_RSI;
  uVar2 = in_RSI[1];
  local_98._0_4_ = (float)uVar1;
  local_98._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_90._0_4_ = (float)uVar2;
  uStack_90._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_78 = (float)local_98 * 0.001;
  fStack_74 = local_98._4_4_ * 0.001;
  fStack_70 = (float)uStack_90 * 0.001;
  fStack_6c = uStack_90._4_4_ * 0.001;
  local_60 = &local_148;
  local_38 = CONCAT44(fStack_74,local_78);
  P_00 = (Vec3fa *)CONCAT44(fStack_6c,fStack_70);
  local_c8 = &local_138;
  local_d8 = &local_148;
  uVar3 = *in_RDI;
  uVar4 = in_RDI[1];
  local_28._0_4_ = (float)uVar3;
  local_28._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_20._0_4_ = (float)uVar4;
  uStack_20._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_58 = (float)local_28 + local_78;
  fStack_54 = local_28._4_4_ + fStack_74;
  fStack_50 = (float)uStack_20 + fStack_70;
  fStack_4c = uStack_20._4_4_ + fStack_6c;
  local_40 = &local_138;
  local_138 = CONCAT44(fStack_54,local_58);
  uStack_130 = CONCAT44(fStack_4c,fStack_50);
  local_98 = uVar1;
  uStack_90 = uVar2;
  pVStack_30 = P_00;
  local_28 = uVar3;
  uStack_20 = uVar4;
  local_148 = local_38;
  fVar5 = displacement(P_00);
  fVar6 = displacement(P_00);
  return (fVar5 - fVar6) / 0.001;
}

Assistant:

float displacement_dv(const Vec3fa& P, const Vec3fa& dPdv)
{
  const float dv = 0.001f;
  return (displacement(P+dv*dPdv)-displacement(P))/dv;
}